

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Master.cpp
# Opt level: O1

void __thiscall Master::Master(Master *this)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int *piVar4;
  QDebug QVar5;
  int iVar6;
  QSettings *pQVar7;
  undefined8 extraout_RAX;
  Master *ctx;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QString t;
  QDebug local_e8;
  char16_t *pcStack_e0;
  qsizetype local_d8;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  undefined8 local_b0;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  char *local_90;
  QArrayData *local_88;
  char16_t *pcStack_80;
  qsizetype local_78;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QList<const_AudioDevice_*> local_48;
  
  QObject::QObject(&this->super_QObject,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_001c8890;
  (this->synthProfileName).d.d = (Data *)0x0;
  (this->synthProfileName).d.ptr = (char16_t *)0x0;
  (this->synthProfileName).d.size = 0;
  (this->synthRoutes).d.d = (Data *)0x0;
  (this->synthRoutes).d.ptr = (SynthRoute **)0x0;
  (this->synthRoutes).d.size = 0;
  (this->audioDrivers).d.d = (Data *)0x0;
  (this->audioDrivers).d.ptr = (AudioDriver **)0x0;
  (this->audioDrivers).d.size = 0;
  (this->audioDevices).d.d = (Data *)0x0;
  (this->audioDevices).d.ptr = (AudioDevice **)0x0;
  (this->audioDevices).d.size = 0;
  (this->defaultAudioDriverId).d.d = (Data *)0x0;
  (this->defaultAudioDriverId).d.ptr = (char16_t *)0x0;
  (this->defaultAudioDriverId).d.size = 0;
  (this->defaultAudioDeviceName).d.d = (Data *)0x0;
  (this->defaultAudioDeviceName).d.ptr = (char16_t *)0x0;
  (this->defaultAudioDeviceName).d.size = 0;
  if (instance == (Master *)0x0) {
    instance = this;
    this->maxSessions = 0;
    QObject::thread();
    ctx = this;
    QObject::moveToThread((QThread *)this);
    MasterClock::init((EVP_PKEY_CTX *)ctx);
    pQVar7 = (QSettings *)operator_new(0x10);
    QVar8.m_data = (storage_type *)0xb;
    QVar8.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar8);
    local_c8.shared = (PrivateShared *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
    local_c8._8_8_ = CONCAT44(local_a8._12_4_,local_a8._8_4_);
    local_c8._16_8_ = CONCAT44(local_a8._20_4_,local_a8._16_4_);
    QVar9.m_data = (storage_type *)0xf;
    QVar9.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar9);
    local_e8.stream = (Stream *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
    QSettings::QSettings(pQVar7,(QString *)local_c8.data,(QString *)&local_e8,(QObject *)0x0);
    this->settings = pQVar7;
    if ((QArrayData *)local_e8.stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_e8.stream = *(int *)local_e8.stream + -1;
      UNLOCK();
      if (*(int *)local_e8.stream == 0) {
        QArrayData::deallocate((QArrayData *)local_e8.stream,2,8);
      }
    }
    if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
      UNLOCK();
      if (*(int *)local_c8.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
      }
    }
    pQVar7 = this->settings;
    QVar10.m_data = (storage_type *)0x16;
    QVar10.m_size = (qsizetype)&local_c8;
    QString::fromUtf8(QVar10);
    local_e8.stream = (Stream *)local_c8.shared;
    pcStack_e0 = (char16_t *)local_c8._8_8_;
    local_d8 = local_c8._16_8_;
    QVariant::QVariant((QVariant *)&local_c8,1);
    QSettings::value((QString *)local_a8.data,(QVariant *)pQVar7);
    iVar6 = QVariant::toInt((bool *)local_a8.data);
    QVariant::~QVariant((QVariant *)&local_a8);
    QVariant::~QVariant((QVariant *)&local_c8);
    if ((QArrayData *)local_e8.stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_e8.stream = *(int *)local_e8.stream + -1;
      UNLOCK();
      if (*(int *)local_e8.stream == 0) {
        QArrayData::deallocate((QArrayData *)local_e8.stream,2,8);
      }
    }
    if (iVar6 != 2) {
      pQVar7 = this->settings;
      local_a8._0_4_ = 2;
      local_a8._4_4_ = 0;
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      local_a8._16_4_ = 0;
      local_a8._20_4_ = 0;
      local_90 = "default";
      QMessageLogger::debug();
      QVar5.stream = local_e8.stream;
      QVar11.m_data = (storage_type *)0x1f;
      QVar11.m_size = (qsizetype)&local_c8;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)local_c8.data);
      if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
        UNLOCK();
        if (*(int *)local_c8.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
        }
      }
      if ((char)(((QArrayData *)(local_e8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_e8.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_e8.stream,iVar6);
      if ((char)(((QArrayData *)(local_e8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_e8.stream,' ');
      }
      QVar5.stream = local_e8.stream;
      QVar12.m_data = (storage_type *)0xa;
      QVar12.m_size = (qsizetype)&local_c8;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)local_c8.data);
      if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
        UNLOCK();
        if (*(int *)local_c8.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
        }
      }
      if ((char)(((QArrayData *)(local_e8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_e8.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_e8.stream,2);
      if ((char)(((QArrayData *)(local_e8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_e8.stream,' ');
      }
      QDebug::~QDebug(&local_e8);
      if (iVar6 == 1) {
        AudioDriver::migrateAudioSettingsFromVersion1();
        QVar13.m_data = (storage_type *)0x16;
        QVar13.m_size = (qsizetype)&local_a8;
        QString::fromUtf8(QVar13);
        local_c8.shared = (PrivateShared *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
        local_c8._8_8_ = CONCAT44(local_a8._12_4_,local_a8._8_4_);
        local_c8._16_8_ = CONCAT44(local_a8._20_4_,local_a8._16_4_);
        QVariant::QVariant((QVariant *)&local_a8,2);
        QSettings::setValue((QString *)pQVar7,(QVariant *)local_c8.data);
        QVariant::~QVariant((QVariant *)&local_a8);
      }
      else {
        local_a8._0_4_ = 2;
        local_a8._4_4_ = 0;
        local_a8._8_4_ = 0;
        local_a8._12_4_ = 0;
        local_a8._16_4_ = 0;
        local_a8._20_4_ = 0;
        local_90 = "default";
        QMessageLogger::debug();
        QVar5.stream = local_e8.stream;
        QVar14.m_data = (storage_type *)0x10;
        QVar14.m_size = (qsizetype)&local_c8;
        QString::fromUtf8(QVar14);
        QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)local_c8.data);
        if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
          UNLOCK();
          if (*(int *)local_c8.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
          }
        }
        if ((char)(((QArrayData *)(local_e8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_e8.stream,' ');
        }
        QDebug::~QDebug(&local_e8);
        QVar15.m_data = (storage_type *)0x1c;
        QVar15.m_size = (qsizetype)&local_a8;
        QString::fromUtf8(QVar15);
        local_c8.shared = (PrivateShared *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
        local_c8._8_8_ = CONCAT44(local_a8._12_4_,local_a8._8_4_);
        local_c8._16_8_ = CONCAT44(local_a8._20_4_,local_a8._16_4_);
        local_68 = (QArrayData *)0x0;
        uStack_60 = 0;
        local_58 = 0;
        QString::setNum((longlong)&local_68,iVar6);
        QVar16.m_data = (storage_type *)0x3b;
        QVar16.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar16);
        QString::append((QString *)&local_88);
        local_e8.stream = (Stream *)local_88;
        pcStack_e0 = pcStack_80;
        local_d8 = local_78;
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QVar17.m_data = (storage_type *)0x1d;
        QVar17.m_size = (qsizetype)&local_a8;
        QString::fromUtf8(QVar17);
        QString::append((QString *)&local_e8);
        piVar4 = (int *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_),2,8);
          }
        }
        QMessageBox::warning(0,&local_c8,&local_e8,0x400,0);
        if ((QArrayData *)local_e8.stream != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_e8.stream = *(int *)local_e8.stream + -1;
          UNLOCK();
          if (*(int *)local_e8.stream == 0) {
            QArrayData::deallocate((QArrayData *)local_e8.stream,2,8);
          }
        }
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88,2,8);
          }
        }
        if (local_68 != (QArrayData *)0x0) {
          LOCK();
          (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_68,2,8);
          }
        }
      }
      if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
        UNLOCK();
        if (*(int *)local_c8.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
        }
      }
    }
    pQVar7 = this->settings;
    QVar18.m_data = (storage_type *)0x1a;
    QVar18.m_size = (qsizetype)&local_c8;
    QString::fromUtf8(QVar18);
    local_88 = (QArrayData *)local_c8.shared;
    pcStack_80 = (char16_t *)local_c8._8_8_;
    local_78 = local_c8._16_8_;
    QVariant::QVariant((QVariant *)&local_c8,"default");
    QSettings::value((QString *)local_a8.data,(QVariant *)pQVar7);
    QVariant::toString();
    pQVar1 = &((this->synthProfileName).d.d)->super_QArrayData;
    (this->synthProfileName).d.d = (Data *)local_e8.stream;
    pcVar2 = (this->synthProfileName).d.ptr;
    (this->synthProfileName).d.ptr = pcStack_e0;
    qVar3 = (this->synthProfileName).d.size;
    (this->synthProfileName).d.size = local_d8;
    local_e8.stream = (Stream *)pQVar1;
    pcStack_e0 = pcVar2;
    local_d8 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    QVariant::~QVariant((QVariant *)&local_a8);
    QVariant::~QVariant((QVariant *)&local_c8);
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,8);
      }
    }
    this->trayIcon = (QSystemTrayIcon *)0x0;
    pQVar7 = this->settings;
    QVar19.m_data = (storage_type *)0x19;
    QVar19.m_size = (qsizetype)&local_c8;
    QString::fromUtf8(QVar19);
    local_88 = (QArrayData *)local_c8.shared;
    pcStack_80 = (char16_t *)local_c8._8_8_;
    local_78 = local_c8._16_8_;
    local_c8.shared = (PrivateShared *)0x0;
    local_c8._8_8_ = 0;
    local_c8._16_8_ = 0;
    local_b0 = 2;
    QSettings::value((QString *)local_a8.data,(QVariant *)pQVar7);
    QVariant::toString();
    pQVar1 = &((this->defaultAudioDriverId).d.d)->super_QArrayData;
    (this->defaultAudioDriverId).d.d = (Data *)local_e8.stream;
    pcVar2 = (this->defaultAudioDriverId).d.ptr;
    (this->defaultAudioDriverId).d.ptr = pcStack_e0;
    qVar3 = (this->defaultAudioDriverId).d.size;
    (this->defaultAudioDriverId).d.size = local_d8;
    local_e8.stream = (Stream *)pQVar1;
    pcStack_e0 = pcVar2;
    local_d8 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    QVariant::~QVariant((QVariant *)&local_a8);
    QVariant::~QVariant((QVariant *)&local_c8);
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,8);
      }
    }
    pQVar7 = this->settings;
    QVar20.m_data = (storage_type *)0x19;
    QVar20.m_size = (qsizetype)&local_c8;
    QString::fromUtf8(QVar20);
    local_88 = (QArrayData *)local_c8.shared;
    pcStack_80 = (char16_t *)local_c8._8_8_;
    local_78 = local_c8._16_8_;
    local_c8.shared = (PrivateShared *)0x0;
    local_c8._8_8_ = 0;
    local_c8._16_8_ = 0;
    local_b0 = 2;
    QSettings::value((QString *)local_a8.data,(QVariant *)pQVar7);
    QVariant::toString();
    pQVar1 = &((this->defaultAudioDeviceName).d.d)->super_QArrayData;
    (this->defaultAudioDeviceName).d.d = (Data *)local_e8.stream;
    pcVar2 = (this->defaultAudioDeviceName).d.ptr;
    (this->defaultAudioDeviceName).d.ptr = pcStack_e0;
    qVar3 = (this->defaultAudioDeviceName).d.size;
    (this->defaultAudioDeviceName).d.size = local_d8;
    local_e8.stream = (Stream *)pQVar1;
    pcStack_e0 = pcVar2;
    local_d8 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    QVariant::~QVariant((QVariant *)&local_a8);
    QVariant::~QVariant((QVariant *)&local_c8);
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,8);
      }
    }
    initAudioDrivers(this);
    initMidiDrivers(this);
    this->lastAudioDeviceScan = -4000000000;
    getAudioDevices(&local_48,this);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,8);
      }
    }
    this->pinnedSynthRoute = (SynthRoute *)0x0;
    this->audioFileWriterSynth = (QSynth *)0x0;
    qRegisterMetaType<MidiDriver*>("MidiDriver*");
    qRegisterMetaType<MidiSession*>("MidiSession*");
    qRegisterMetaType<MidiSession**>("MidiSession**");
    qRegisterMetaType<SynthState>("SynthState");
    return;
  }
  Master((Master *)&local_a8);
  if ((QArrayData *)local_e8.stream != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_e8.stream = *(int *)local_e8.stream + -1;
    UNLOCK();
    if (*(int *)local_e8.stream == 0) {
      QArrayData::deallocate((QArrayData *)local_e8.stream,2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
    UNLOCK();
    if (*(int *)local_c8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
    }
  }
  QString::~QString(&this->defaultAudioDeviceName);
  QString::~QString(&this->defaultAudioDriverId);
  QString::~QString(&this->synthProfileName);
  QList<const_AudioDevice_*>::~QList(&this->audioDevices);
  QList<AudioDriver_*>::~QList(&this->audioDrivers);
  QList<SynthRoute_*>::~QList(&this->synthRoutes);
  QObject::~QObject(&this->super_QObject);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Master::Master() {
	if (instance != NULL) {
		qFatal("Master already instantiated!");
		// Do nothing if ignored
		return;
	}
	instance = this;
	maxSessions = 0;

	moveToThread(QCoreApplication::instance()->thread());

	MasterClock::init();

	settings = new QSettings("muntemu.org", "Munt mt32emu-qt");
	int settingsVersion = settings->value("Master/settingsVersion", 1).toInt();
	if (settingsVersion != ACTUAL_SETTINGS_VERSION) {
		migrateSettings(*settings, settingsVersion);
	}

	synthProfileName = settings->value("Master/defaultSynthProfile", "default").toString();

	trayIcon = NULL;
	defaultAudioDriverId = settings->value("Master/DefaultAudioDriver").toString();
	defaultAudioDeviceName = settings->value("Master/DefaultAudioDevice").toString();

	initAudioDrivers();
	initMidiDrivers();
	lastAudioDeviceScan = -4 * MasterClock::NANOS_PER_SECOND;
	getAudioDevices();
	pinnedSynthRoute = NULL;
	audioFileWriterSynth = NULL;

	qRegisterMetaType<MidiDriver *>("MidiDriver*");
	qRegisterMetaType<MidiSession *>("MidiSession*");
	qRegisterMetaType<MidiSession **>("MidiSession**");
	qRegisterMetaType<SynthState>("SynthState");
}